

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_lctl(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  CPUState *pCVar4;
  uintptr_t unaff_retaddr;
  uint local_44;
  uint32_t val;
  uint32_t i;
  uint64_t src;
  _Bool PERchanged;
  uintptr_t ra;
  uint32_t r3_local;
  uint64_t a2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  bVar1 = false;
  local_44 = r1;
  _val = a2;
  if ((a2 & 3) == 0) {
    while( true ) {
      uVar2 = cpu_ldl_data_ra_s390x(env,_val,unaff_retaddr);
      if ((((uint32_t)env->cregs[local_44] != uVar2) && (8 < local_44)) && (local_44 < 0xc)) {
        bVar1 = true;
      }
      uVar3 = deposit64(env->cregs[local_44],0,0x20,(ulong)uVar2);
      env->cregs[local_44] = uVar3;
      _val = _val + 4;
      if (local_44 == r3) break;
      local_44 = local_44 + 1 & 0xf;
    }
    if ((bVar1) && (((env->psw).mask & 0x4000000000000000) != 0)) {
      pCVar4 = env_cpu(env);
      s390_cpu_recompute_watchpoints(pCVar4);
    }
    pCVar4 = env_cpu(env);
    tlb_flush_s390x(pCVar4);
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(lctl)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    bool PERchanged = false;
    uint64_t src = a2;
    uint32_t i;

    if (src & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        uint32_t val = cpu_ldl_data_ra(env, src, ra);
        if ((uint32_t)env->cregs[i] != val && i >= 9 && i <= 11) {
            PERchanged = true;
        }
        env->cregs[i] = deposit64(env->cregs[i], 0, 32, val);
        HELPER_LOG("load ctl %d from 0x%" PRIx64 " == 0x%x\n", i, src, val);
        src += sizeof(uint32_t);

        if (i == r3) {
            break;
        }
    }

    if (PERchanged && env->psw.mask & PSW_MASK_PER) {
        s390_cpu_recompute_watchpoints(env_cpu(env));
    }

    tlb_flush(env_cpu(env));
}